

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O3

void __thiscall QpVector::resparsify(QpVector *this)

{
  double dVar1;
  pointer piVar2;
  pointer pdVar3;
  long lVar4;
  int iVar5;
  
  this->num_nz = 0;
  iVar5 = this->dim;
  if (0 < iVar5) {
    piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      dVar1 = pdVar3[lVar4];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        iVar5 = this->num_nz;
        this->num_nz = iVar5 + 1;
        piVar2[iVar5] = (int)lVar4;
        iVar5 = this->dim;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar5);
  }
  return;
}

Assistant:

void resparsify() {
    num_nz = 0;
    for (HighsInt i = 0; i < dim; i++) {
      if (value[i] != 0.0) {
        index[num_nz++] = i;
      }
    }
  }